

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall asmjit::Assembler::Assembler(Assembler *this)

{
  CodeEmitter *in_RDI;
  
  CodeEmitter::CodeEmitter(in_RDI,(uint32_t)((ulong)in_RDI >> 0x20));
  in_RDI->_vptr_CodeEmitter = (_func_int **)&PTR__Assembler_003135a0;
  in_RDI[1]._vptr_CodeEmitter = (_func_int **)0x0;
  in_RDI[1]._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  in_RDI[1]._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  in_RDI[1]._codeInfo._baseAddress = 0;
  in_RDI[1]._code = (CodeHolder *)0x0;
  memset(&in_RDI[1]._nextEmitter,0,0x10);
  memset(&in_RDI[1]._privateData,0,0x10);
  return;
}

Assistant:

Assembler::Assembler() noexcept
  : CodeEmitter(kTypeAssembler),
    _section(nullptr),
    _bufferData(nullptr),
    _bufferEnd(nullptr),
    _bufferPtr(nullptr),
    _op4(),
    _op5() {}